

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SplayTree.cpp
# Opt level: O0

Node * __thiscall SplayTree::findMax(SplayTree *this,Node *node)

{
  Node *node_local;
  SplayTree *this_local;
  
  if (node == (Node *)0x0) {
    this_local = (SplayTree *)0x0;
  }
  else {
    this_local = (SplayTree *)node;
    if (node->rightChild != (Node *)0x0) {
      this_local = (SplayTree *)findMax(this,node->rightChild);
    }
  }
  return (Node *)this_local;
}

Assistant:

SplayTree::Node *SplayTree::findMax(Node *node) {
    if (node == nullptr) {
        return nullptr;
    } else if (node->rightChild == nullptr) {
        return node;
    } else {
        return findMax(node->rightChild);
    }
}